

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-alive.c
# Opt level: O2

int run_test_loop_alive(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_10;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_alive(puVar2);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    uv_timer_init(puVar2,&timer_handle);
    uv_timer_start(&timer_handle,timer_cb,100,0);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_alive(puVar2);
    if (iVar1 == 0) {
      pcVar3 = "uv_loop_alive(uv_default_loop())";
      uStack_10 = 0x33;
    }
    else {
      puVar2 = uv_default_loop();
      iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
      if (iVar1 == 0) {
        puVar2 = uv_default_loop();
        iVar1 = uv_loop_alive(puVar2);
        if (iVar1 == 0) {
          puVar2 = uv_default_loop();
          iVar1 = uv_queue_work(puVar2,&work_req,work_cb,after_work_cb);
          if (iVar1 == 0) {
            puVar2 = uv_default_loop();
            iVar1 = uv_loop_alive(puVar2);
            if (iVar1 == 0) {
              pcVar3 = "uv_loop_alive(uv_default_loop())";
              uStack_10 = 0x3c;
            }
            else {
              puVar2 = uv_default_loop();
              iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
              if (iVar1 == 0) {
                puVar2 = uv_default_loop();
                iVar1 = uv_loop_alive(puVar2);
                if (iVar1 == 0) {
                  return 0;
                }
                pcVar3 = "!uv_loop_alive(uv_default_loop())";
                uStack_10 = 0x40;
              }
              else {
                pcVar3 = "r == 0";
                uStack_10 = 0x3f;
              }
            }
          }
          else {
            pcVar3 = "r == 0";
            uStack_10 = 0x3b;
          }
        }
        else {
          pcVar3 = "!uv_loop_alive(uv_default_loop())";
          uStack_10 = 0x37;
        }
      }
      else {
        pcVar3 = "r == 0";
        uStack_10 = 0x36;
      }
    }
  }
  else {
    pcVar3 = "!uv_loop_alive(uv_default_loop())";
    uStack_10 = 0x2e;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-alive.c"
          ,uStack_10,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(loop_alive) {
  int r;
  ASSERT(!uv_loop_alive(uv_default_loop()));

  /* loops with handles are alive */
  uv_timer_init(uv_default_loop(), &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 100, 0);
  ASSERT(uv_loop_alive(uv_default_loop()));

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(!uv_loop_alive(uv_default_loop()));

  /* loops with requests are alive */
  r = uv_queue_work(uv_default_loop(), &work_req, work_cb, after_work_cb);
  ASSERT(r == 0);
  ASSERT(uv_loop_alive(uv_default_loop()));

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(!uv_loop_alive(uv_default_loop()));

  return 0;
}